

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::VariableExpression::derivative(VariableExpression *this,VariableExpressionPtr *variable)

{
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseExpressionPtr BVar1;
  undefined1 local_38 [32];
  code *local_18;
  code *local_10;
  
  if ((VariableExpressionPtr *)*in_RDX == variable) {
    local_38._8_8_ = 1.0;
  }
  else {
    local_38._8_8_ = 0.0;
  }
  local_38._0_8_ = &PTR_evaluate_0011b828;
  local_38._24_8_ = 0;
  local_38._16_8_ = defaultFormatter_abi_cxx11_;
  local_10 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(double)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(double)>
             ::_M_manager;
  makePtr2<Kandinsky::Constant>(this);
  Constant::~Constant((Constant *)local_38);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BaseExpression;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr VariableExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(Constant(variable.get() == this));
    }